

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockNodeUpdateForRootNode(ImGuiDockNode *node)

{
  ImGuiWindow *pIVar1;
  ImGuiWindow **ppIVar2;
  ImGuiDockNode *local_48;
  long local_40;
  ImGuiDockNode *mark_node;
  int n;
  ImGuiDockNode *first_node_with_windows;
  ImGuiDockNodeTreeInfo info;
  ImGuiDockNode *node_local;
  
  info._16_8_ = node;
  DockNodeUpdateFlagsAndCollapse(node);
  ImGuiDockNodeTreeInfo::ImGuiDockNodeTreeInfo((ImGuiDockNodeTreeInfo *)&first_node_with_windows);
  DockNodeFindInfo((ImGuiDockNode *)info._16_8_,(ImGuiDockNodeTreeInfo *)&first_node_with_windows);
  *(ImGuiDockNode **)(info._16_8_ + 0x98) = first_node_with_windows;
  if ((int)info.FirstNodeWithWindows == 1) {
    local_48 = info.CentralNode;
  }
  else {
    local_48 = (ImGuiDockNode *)0x0;
  }
  *(ImGuiDockNode **)(info._16_8_ + 0xa0) = local_48;
  *(int *)(info._16_8_ + 0xa8) = (int)info.FirstNodeWithWindows;
  if ((*(int *)(info._16_8_ + 0xb8) == 0) && (info.CentralNode != (ImGuiDockNode *)0x0)) {
    *(ImGuiID *)(info._16_8_ + 0xb8) = (info.CentralNode)->ID;
  }
  if (info.CentralNode != (ImGuiDockNode *)0x0) {
    ppIVar2 = ImVector<ImGuiWindow_*>::operator[](&(info.CentralNode)->Windows,0);
    pIVar1 = *ppIVar2;
    *(undefined8 *)(info._16_8_ + 100) = *(undefined8 *)&pIVar1->WindowClass;
    *(undefined8 *)(info._16_8_ + 0x6c) =
         *(undefined8 *)&(pIVar1->WindowClass).ViewportFlagsOverrideSet;
    *(undefined8 *)(info._16_8_ + 0x74) =
         *(undefined8 *)&(pIVar1->WindowClass).TabItemFlagsOverrideSet;
    *(undefined2 *)(info._16_8_ + 0x7c) = *(undefined2 *)&(pIVar1->WindowClass).DockingAlwaysTabBar;
    for (mark_node._4_4_ = 1; mark_node._4_4_ < ((info.CentralNode)->Windows).Size;
        mark_node._4_4_ = mark_node._4_4_ + 1) {
      ppIVar2 = ImVector<ImGuiWindow_*>::operator[](&(info.CentralNode)->Windows,mark_node._4_4_);
      if ((((*ppIVar2)->WindowClass).DockingAllowUnclassed & 1U) == 0) {
        ppIVar2 = ImVector<ImGuiWindow_*>::operator[](&(info.CentralNode)->Windows,mark_node._4_4_);
        pIVar1 = *ppIVar2;
        *(undefined8 *)(info._16_8_ + 100) = *(undefined8 *)&pIVar1->WindowClass;
        *(undefined8 *)(info._16_8_ + 0x6c) =
             *(undefined8 *)&(pIVar1->WindowClass).ViewportFlagsOverrideSet;
        *(undefined8 *)(info._16_8_ + 0x74) =
             *(undefined8 *)&(pIVar1->WindowClass).TabItemFlagsOverrideSet;
        *(undefined2 *)(info._16_8_ + 0x7c) =
             *(undefined2 *)&(pIVar1->WindowClass).DockingAlwaysTabBar;
        break;
      }
    }
  }
  for (local_40 = *(long *)(info._16_8_ + 0x98); local_40 != 0;
      local_40 = *(long *)(local_40 + 0x18)) {
    *(ushort *)(local_40 + 0xc4) = *(ushort *)(local_40 + 0xc4) & 0xbfff | 0x4000;
  }
  return;
}

Assistant:

static void ImGui::DockNodeUpdateForRootNode(ImGuiDockNode* node)
{
    DockNodeUpdateFlagsAndCollapse(node);

    // - Setup central node pointers
    // - Find if there's only a single visible window in the hierarchy (in which case we need to display a regular title bar -> FIXME-DOCK: that last part is not done yet!)
    // Cannot merge this with DockNodeUpdateFlagsAndCollapse() because FirstNodeWithWindows is found after window removal and child collapsing
    ImGuiDockNodeTreeInfo info;
    DockNodeFindInfo(node, &info);
    node->CentralNode = info.CentralNode;
    node->OnlyNodeWithWindows = (info.CountNodesWithWindows == 1) ? info.FirstNodeWithWindows : NULL;
    node->CountNodeWithWindows = info.CountNodesWithWindows;
    if (node->LastFocusedNodeId == 0 && info.FirstNodeWithWindows != NULL)
        node->LastFocusedNodeId = info.FirstNodeWithWindows->ID;

    // Copy the window class from of our first window so it can be used for proper dock filtering.
    // When node has mixed windows, prioritize the class with the most constraint (DockingAllowUnclassed = false) as the reference to copy.
    // FIXME-DOCK: We don't recurse properly, this code could be reworked to work from DockNodeUpdateScanRec.
    if (ImGuiDockNode* first_node_with_windows = info.FirstNodeWithWindows)
    {
        node->WindowClass = first_node_with_windows->Windows[0]->WindowClass;
        for (int n = 1; n < first_node_with_windows->Windows.Size; n++)
            if (first_node_with_windows->Windows[n]->WindowClass.DockingAllowUnclassed == false)
            {
                node->WindowClass = first_node_with_windows->Windows[n]->WindowClass;
                break;
            }
    }

    ImGuiDockNode* mark_node = node->CentralNode;
    while (mark_node)
    {
        mark_node->HasCentralNodeChild = true;
        mark_node = mark_node->ParentNode;
    }
}